

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<float>::TPZFileEqnStorage(TPZFileEqnStorage<float> *this,char option,string *name)

{
  char *pcVar1;
  FILE *pFVar2;
  string *in_RDX;
  char in_SIL;
  TPZRegisterClassId *in_RDI;
  TPZFileEqnStorage<float> *this_00;
  int zero;
  int64_t sizereturn;
  TPZStack<long,_10> *in_stack_ffffffffffffff90;
  undefined4 local_44;
  size_t local_40;
  undefined8 local_28;
  undefined8 local_20;
  string *local_18;
  char local_9;
  
  local_20 = 0;
  local_28 = 0x21;
  local_18 = in_RDX;
  local_9 = in_SIL;
  TPZRegisterClassId::TPZRegisterClassId<TPZFileEqnStorage<float>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02541110);
  *(undefined ***)in_RDI = &PTR__TPZFileEqnStorage_025410c0;
  TPZStack<long,_10>::TPZStack(in_stack_ffffffffffffff90);
  this_00 = (TPZFileEqnStorage<float> *)(in_RDI + 0x80);
  std::__cxx11::string::string((string *)this_00);
  *(undefined4 *)(in_RDI + 0xac) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xb0) = 0;
  *(undefined4 *)(in_RDI + 0xa8) = 0;
  *(undefined4 *)(in_RDI + 8) = 0x14;
  std::__cxx11::string::operator=((string *)this_00,local_18);
  if (local_9 == 'r') {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen(pcVar1,"rb");
    *(FILE **)(in_RDI + 0xa0) = pFVar2;
    local_40 = 0;
    local_40 = fread(in_RDI + 8,4,1,*(FILE **)(in_RDI + 0xa0));
    local_40 = fread(in_RDI + 0xb0,4,1,*(FILE **)(in_RDI + 0xa0));
    ReadBlockPositions(this_00);
  }
  else if (local_9 == 'w') {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen(pcVar1,"wb");
    *(FILE **)(in_RDI + 0xa0) = pFVar2;
    local_44 = 0;
    fwrite(in_RDI + 8,4,1,*(FILE **)(in_RDI + 0xa0));
    fwrite(&local_44,4,1,*(FILE **)(in_RDI + 0xa0));
  }
  return;
}

Assistant:

TPZFileEqnStorage<TVar>::TPZFileEqnStorage(char option, const std::string & name)
: TPZRegisterClassId(&TPZFileEqnStorage<TVar>::ClassId)
{
	fCurBlockPosition = -1;
	fNumBlocks=0;
	fCurrentBlock=0;
	fNumHeaders=20;
	fFileName = name;
	if(option=='r'){
		fIOStream = fopen(fFileName.c_str(),"rb"); //open for reading
		/**
		 *Opens binary files and get initial information
		 *use this information for storage requirements
		 */
		int64_t sizereturn;
		sizereturn = 0;
		sizereturn = fread(&fNumHeaders,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != 1) DebugStop();
#endif
		sizereturn = fread(&fNumBlocks,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != 1) DebugStop();
#endif
		ReadBlockPositions();
	}else if(option=='w'){
		fIOStream = fopen(fFileName.c_str(),"wb"); //open for writing
		/**
		 *Writes NumHeaders and NumBlocks information in
		 *the two initial positions on fIOStream
		 */
		int zero = 0;
		fwrite(&fNumHeaders,sizeof(int),1,fIOStream);
		fwrite(&zero,sizeof(int),1,fIOStream);
		//fCurBlockPosition = ftell(fIOStream);
	}
}